

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O0

void __thiscall
Assimp::DXFImporter::GenerateMaterials(DXFImporter *this,aiScene *pScene,FileData *param_2)

{
  aiMaterial *this_00;
  aiMaterial **ppaVar1;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [8];
  aiColor4D clrDiffuse;
  aiString s;
  aiMaterial *pcMat;
  FileData *param_2_local;
  aiScene *pScene_local;
  DXFImporter *this_local;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  aiString::aiString((aiString *)&clrDiffuse.b);
  aiString::Set((aiString *)&clrDiffuse.b,"DefaultMaterial");
  aiMaterial::AddProperty(this_00,(aiString *)&clrDiffuse.b,"?mat.name",0,0);
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)local_448,0.9,0.9,0.9,1.0);
  aiMaterial::AddProperty(this_00,(aiColor4D *)local_448,1,"$clr.diffuse",0,0);
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)local_458,1.0,1.0,1.0,1.0);
  local_448 = (undefined1  [8])local_458._0_8_;
  clrDiffuse.r = (float)local_458._8_4_;
  clrDiffuse.g = (float)local_458._12_4_;
  aiMaterial::AddProperty(this_00,(aiColor4D *)local_448,1,"$clr.specular",0,0);
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)local_468,0.05,0.05,0.05,1.0);
  local_448 = (undefined1  [8])local_468._0_8_;
  clrDiffuse.r = (float)local_468._8_4_;
  clrDiffuse.g = (float)local_468._12_4_;
  aiMaterial::AddProperty(this_00,(aiColor4D *)local_448,1,"$clr.ambient",0,0);
  pScene->mNumMaterials = 1;
  ppaVar1 = (aiMaterial **)operator_new__(8);
  pScene->mMaterials = ppaVar1;
  *pScene->mMaterials = this_00;
  return;
}

Assistant:

void DXFImporter::GenerateMaterials(aiScene* pScene, DXF::FileData& /*output*/) {
    // generate an almost-white default material. Reason:
    // the default vertex color is GREY, so we are
    // already at Assimp's usual default color.
    // generate a default material
    aiMaterial* pcMat = new aiMaterial();
    aiString s;
    s.Set(AI_DEFAULT_MATERIAL_NAME);
    pcMat->AddProperty(&s, AI_MATKEY_NAME);

    aiColor4D clrDiffuse(0.9f,0.9f,0.9f,1.0f);
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_DIFFUSE);

    clrDiffuse = aiColor4D(1.0f,1.0f,1.0f,1.0f);
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_SPECULAR);

    clrDiffuse = aiColor4D(0.05f,0.05f,0.05f,1.0f);
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_AMBIENT);

    pScene->mNumMaterials = 1;
    pScene->mMaterials = new aiMaterial*[1];
    pScene->mMaterials[0] = pcMat;
}